

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

void __thiscall
bloaty::RollupOutput::PrettyPrintTree
          (RollupOutput *this,RollupRow *row,size_t indent,OutputOptions *options,ostream *out)

{
  bool bVar1;
  pointer pRVar2;
  RollupRow *child;
  pointer row_00;
  
  PrettyPrintRow(this,row,indent,options,out);
  if ((row->size).file != 0 || (row->size).vm != 0) {
    row_00 = (row->sorted_children).
             super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
             super__Vector_impl_data._M_start;
    pRVar2 = (row->sorted_children).
             super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (((long)pRVar2 - (long)row_00 == 0x88) &&
       ((row_00->sorted_children).
        super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (row_00->sorted_children).
        super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      bVar1 = IsSame(&row->name,&row_00->name);
      if (bVar1) {
        return;
      }
      row_00 = (row->sorted_children).
               super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
               super__Vector_impl_data._M_start;
      pRVar2 = (row->sorted_children).
               super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    if (row_00 != pRVar2) {
      do {
        PrettyPrintTree(this,row_00,indent + 2,options,out);
        row_00 = row_00 + 1;
      } while (row_00 != pRVar2);
    }
  }
  return;
}

Assistant:

void RollupOutput::PrettyPrintTree(const RollupRow& row, size_t indent,
                                   const OutputOptions& options,
                                   std::ostream* out) const {
  // Rows are printed before their sub-rows.
  PrettyPrintRow(row, indent, options, out);

  if (!row.size.vm && !row.size.file) {
    return;
  }

  if (row.sorted_children.size() == 1 &&
      row.sorted_children[0].sorted_children.size() == 0 &&
      IsSame(row.name, row.sorted_children[0].name)) {
    return;
  }

  for (const auto& child : row.sorted_children) {
    PrettyPrintTree(child, indent + 2, options, out);
  }
}